

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.h
# Opt level: O1

void __thiscall
GdlBinaryExpression::GdlBinaryExpression(GdlBinaryExpression *this,GdlBinaryExpression *exp)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  GdlObject::GdlObject
            (&(this->super_GdlExpression).super_GdlObject,
             &(exp->super_GdlExpression).super_GdlObject);
  (this->super_GdlExpression)._vptr_GdlExpression = (_func_int **)&PTR___cxa_pure_virtual_00241ec8;
  (this->super_GdlExpression).m_exptResult = (exp->super_GdlExpression).m_exptResult;
  (this->super_GdlExpression)._vptr_GdlExpression = (_func_int **)&PTR_Clone_002423f8;
  this->m_psymOperator = exp->m_psymOperator;
  iVar1 = (**exp->m_pexpOperand1->_vptr_GdlExpression)();
  this->m_pexpOperand1 = (GdlExpression *)CONCAT44(extraout_var,iVar1);
  iVar1 = (**exp->m_pexpOperand2->_vptr_GdlExpression)();
  this->m_pexpOperand2 = (GdlExpression *)CONCAT44(extraout_var_00,iVar1);
  return;
}

Assistant:

GdlBinaryExpression(const GdlBinaryExpression & exp)
		:	GdlExpression(exp),
			m_psymOperator(exp.m_psymOperator),
			m_pexpOperand1(exp.m_pexpOperand1->Clone()),
			m_pexpOperand2(exp.m_pexpOperand2->Clone())
	{
	}